

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_distribution.hpp
# Opt level: O1

result_type __thiscall
boost::random::normal_distribution<double>::operator()
          (normal_distribution<double> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *eng)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double in_XMM2_Qa;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM4 [16];
  
  if (this->_valid == false) {
    uVar4 = (ulong)eng->_x;
    do {
      uVar4 = (uVar4 * 0xbc8f) % 0x7fffffff;
      auVar10 = vcvtusi2sd_avx512f(in_XMM4,(uint)uVar4 - 1);
      dVar5 = auVar10._0_8_ * 4.656612877414201e-10;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar5;
      uVar2 = vcmpsd_avx512f(auVar10,ZEXT816(0x3ff0000000000000),5);
      bVar3 = (bool)((byte)uVar2 & 1);
      in_XMM2_Qa = (double)((ulong)bVar3 * (long)in_XMM2_Qa + (ulong)!bVar3 * (long)dVar5);
    } while (1.0 <= dVar5);
    eng->_x = (uint)uVar4;
    this->_r1 = in_XMM2_Qa;
    do {
      uVar4 = (uVar4 * 0xbc8f) % 0x7fffffff;
      auVar10 = vcvtusi2sd_avx512f(in_XMM4,(uint)uVar4 - 1);
      dVar5 = auVar10._0_8_ * 4.656612877414201e-10;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar5;
      uVar2 = vcmpsd_avx512f(auVar11,ZEXT816(0x3ff0000000000000),5);
      bVar3 = (bool)((byte)uVar2 & 1);
      in_XMM2_Qa = (double)((ulong)bVar3 * (long)in_XMM2_Qa + (ulong)!bVar3 * (long)dVar5);
    } while (1.0 <= dVar5);
    eng->_x = (uint)uVar4;
    this->_r2 = in_XMM2_Qa;
    dVar5 = log(1.0 - in_XMM2_Qa);
    dVar5 = dVar5 * -2.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar5;
      auVar10 = vsqrtsd_avx(auVar7,auVar7);
      dVar5 = auVar10._0_8_;
    }
    this->_cached_rho = dVar5;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  this->_valid = bVar3;
  dVar5 = this->_cached_rho;
  dVar6 = this->_r1 * 6.283185307179586;
  if (bVar3 == false) {
    dVar6 = sin(dVar6);
  }
  else {
    dVar6 = cos(dVar6);
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->_sigma;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->_mean;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6 * dVar5;
  auVar10 = vfmadd213sd_fma(auVar8,auVar9,auVar1);
  return auVar10._0_8_;
}

Assistant:

result_type operator()(Engine& eng)
    {
        using std::sqrt;
        using std::log;
        using std::sin;
        using std::cos;

        if(!_valid) {
            _r1 = boost::uniform_01<RealType>()(eng);
            _r2 = boost::uniform_01<RealType>()(eng);
            _cached_rho = sqrt(-result_type(2) * log(result_type(1)-_r2));
            _valid = true;
        } else {
            _valid = false;
        }
        // Can we have a boost::mathconst please?
        const result_type pi = result_type(3.14159265358979323846);

        return _cached_rho * (_valid ?
                              cos(result_type(2)*pi*_r1) :
                              sin(result_type(2)*pi*_r1))
            * _sigma + _mean;
    }